

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::WriteDependerConnections
          (cmGraphVizWriter *this,string *targetName,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedConnections,cmGeneratedFileStream *str)

{
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  char cVar2;
  long lVar3;
  long *plVar4;
  cmGeneratedFileStream *str_00;
  TargetType TVar5;
  int iVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  iterator iVar9;
  ostream *poVar10;
  _Rb_tree_node_base *p_Var11;
  long *plVar12;
  string myNodeName;
  string libName;
  string connectionName;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  size_t local_88;
  long local_80 [2];
  key_type local_70;
  _Base_ptr local_50;
  _Base_ptr local_48;
  cmGeneratedFileStream *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
          ::find(&(this->TargetPtrs)._M_t,targetName);
  p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)cVar7._M_node != p_Var1) &&
     (WriteNode(this,targetName,*(cmGeneratorTarget **)(cVar7._M_node + 2),insertedNodes,str),
     *(long *)(cVar7._M_node + 2) != 0)) {
    local_38 = &this->TargetNamesNodes;
    local_40 = str;
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_38->_M_t,targetName);
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,*(long *)(cVar8._M_node + 2),
               (long)&(cVar8._M_node[2]._M_parent)->_M_color + *(long *)(cVar8._M_node + 2));
    p_Var11 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      local_48 = &(this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_50 = &(insertedConnections->_M_t)._M_impl.super__Rb_tree_header._M_header;
      do {
        if (*(cmGeneratorTarget **)(p_Var11 + 2) != (cmGeneratorTarget *)0x0) {
          TVar5 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var11 + 2));
          switch(TVar5) {
          case EXECUTABLE:
            cVar2 = this->GenerateForExecutables;
            break;
          case STATIC_LIBRARY:
            cVar2 = this->GenerateForStaticLibs;
            break;
          case SHARED_LIBRARY:
            cVar2 = this->GenerateForSharedLibs;
            break;
          case MODULE_LIBRARY:
            cVar2 = this->GenerateForModuleLibs;
            break;
          default:
            goto switchD_003c68fb_default;
          }
          if (cVar2 != '\0') {
            lVar3 = **(long **)(p_Var11 + 2);
            plVar12 = *(long **)(lVar3 + 0x1e8);
            if (plVar12 != *(long **)(lVar3 + 0x1f0)) {
              __k = p_Var11 + 1;
              do {
                local_90 = local_80;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_90,*plVar12,plVar12[1] + *plVar12);
                plVar4 = local_90;
                if ((local_88 == targetName->_M_string_length) &&
                   ((local_88 == 0 ||
                    (iVar6 = bcmp(local_90,(targetName->_M_dataplus)._M_p,local_88), iVar6 == 0))))
                {
                  cVar8 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::find(&local_38->_M_t,(key_type *)__k);
                  str_00 = local_40;
                  if (cVar8._M_node != local_48) {
                    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_70,*(long *)(cVar8._M_node + 2),
                               (long)&(cVar8._M_node[2]._M_parent)->_M_color +
                               *(long *)(cVar8._M_node + 2));
                    std::__cxx11::string::append((char *)&local_70);
                    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
                    iVar9 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::find(&insertedConnections->_M_t,&local_70);
                    if (iVar9._M_node == local_50) {
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)insertedConnections,&local_70);
                      WriteNode(this,(string *)__k,*(cmGeneratorTarget **)(p_Var11 + 2),
                                insertedNodes,str_00);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)str_00,"    \"",5);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)str_00,*(char **)(cVar8._M_node + 2),
                                           (long)cVar8._M_node[2]._M_parent);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" -> \"",6);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar10,(char *)local_b0,local_a8);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)str_00," // ",4)
                      ;
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)str_00,(targetName->_M_dataplus)._M_p,
                                           targetName->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar10," -> ",4);
                      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar10,*(char **)(p_Var11 + 1),
                                           (long)p_Var11[1]._M_parent);
                      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      WriteDependerConnections
                                (this,(string *)__k,insertedNodes,insertedConnections,str_00);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != &local_70.field_2) {
                      operator_delete(local_70._M_dataplus._M_p,
                                      local_70.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (local_90 != local_80) {
                    operator_delete(local_90,local_80[0] + 1);
                  }
                  break;
                }
                if (plVar4 != local_80) {
                  operator_delete(plVar4,local_80[0] + 1);
                }
                plVar12 = plVar12 + 5;
              } while (plVar12 != *(long **)(lVar3 + 0x1f0));
            }
          }
        }
switchD_003c68fb_default:
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteDependerConnections(
  const std::string& targetName, std::set<std::string>& insertedNodes,
  std::set<std::string>& insertedConnections, cmGeneratedFileStream& str) const
{
  std::map<std::string, const cmGeneratorTarget*>::const_iterator targetPtrIt =
    this->TargetPtrs.find(targetName);

  if (targetPtrIt == this->TargetPtrs.end()) // not found at all
  {
    return;
  }

  this->WriteNode(targetName, targetPtrIt->second, insertedNodes, str);

  if (targetPtrIt->second == CM_NULLPTR) // it's an external library
  {
    return;
  }

  std::string myNodeName = this->TargetNamesNodes.find(targetName)->second;

  // now search who links against me
  for (std::map<std::string, const cmGeneratorTarget*>::const_iterator
         dependerIt = this->TargetPtrs.begin();
       dependerIt != this->TargetPtrs.end(); ++dependerIt) {
    if (dependerIt->second == CM_NULLPTR) {
      continue;
    }

    if (!this->GenerateForTargetType(dependerIt->second->GetType())) {
      continue;
    }

    // Now we have a target, check whether it links against targetName.
    // If so, draw a connection, and then continue with dependers on that one.
    const cmTarget::LinkLibraryVectorType* ll =
      &(dependerIt->second->Target->GetOriginalLinkLibraries());

    for (cmTarget::LinkLibraryVectorType::const_iterator llit = ll->begin();
         llit != ll->end(); ++llit) {
      std::string libName = llit->first;
      if (libName == targetName) {
        // So this target links against targetName.
        std::map<std::string, std::string>::const_iterator dependerNodeNameIt =
          this->TargetNamesNodes.find(dependerIt->first);

        if (dependerNodeNameIt != this->TargetNamesNodes.end()) {
          std::string connectionName = dependerNodeNameIt->second;
          connectionName += "-";
          connectionName += myNodeName;

          if (insertedConnections.find(connectionName) ==
              insertedConnections.end()) {
            insertedConnections.insert(connectionName);
            this->WriteNode(dependerIt->first, dependerIt->second,
                            insertedNodes, str);

            str << "    \"" << dependerNodeNameIt->second << "\" -> \""
                << myNodeName << "\"";
            str << " // " << targetName << " -> " << dependerIt->first
                << std::endl;
            this->WriteDependerConnections(dependerIt->first, insertedNodes,
                                           insertedConnections, str);
          }
        }
        break;
      }
    }
  }
}